

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::LibraryIncDirClauseSyntax::setChild
          (LibraryIncDirClauseSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  undefined4 uVar2;
  SyntaxNode *pSVar3;
  Token TVar4;
  
  if (index == 2) {
    pSVar3 = TokenOrSyntax::node(&child);
    uVar2 = *(undefined4 *)&pSVar3->field_0x4;
    pSVar1 = pSVar3->parent;
    (this->filePaths).super_SyntaxListBase.super_SyntaxNode.kind = pSVar3->kind;
    *(undefined4 *)&(this->filePaths).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar2;
    (this->filePaths).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
    (this->filePaths).super_SyntaxListBase.super_SyntaxNode.previewNode = pSVar3->previewNode;
    (this->filePaths).super_SyntaxListBase.childCount = *(size_t *)(pSVar3 + 1);
    pSVar1 = pSVar3[1].previewNode;
    (this->filePaths).elements._M_ptr = (pointer)pSVar3[1].parent;
    (this->filePaths).elements._M_extent._M_extent_value = (size_t)pSVar1;
  }
  else if (index == 1) {
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->incdir).kind = TVar4.kind;
    (this->incdir).field_0x2 = TVar4._2_1_;
    (this->incdir).numFlags = (NumericTokenFlags)TVar4.numFlags.raw;
    (this->incdir).rawLen = TVar4.rawLen;
    (this->incdir).info = TVar4.info;
  }
  else {
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->minus).kind = TVar4.kind;
    (this->minus).field_0x2 = TVar4._2_1_;
    (this->minus).numFlags = (NumericTokenFlags)TVar4.numFlags.raw;
    (this->minus).rawLen = TVar4.rawLen;
    (this->minus).info = TVar4.info;
  }
  return;
}

Assistant:

void LibraryIncDirClauseSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: minus = child.token(); return;
        case 1: incdir = child.token(); return;
        case 2: filePaths = child.node()->as<SeparatedSyntaxList<FilePathSpecSyntax>>(); return;
        default: SLANG_UNREACHABLE;
    }
}